

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O0

void __thiscall
TorControlConnection::TorControlConnection(TorControlConnection *this,event_base *_base)

{
  long lVar1;
  undefined8 in_RSI;
  TorControlReply *in_RDI;
  long in_FS_OFFSET;
  function<void_(TorControlConnection_&)> *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::function<void_(TorControlConnection_&)>::function(in_stack_ffffffffffffffa8);
  std::function<void_(TorControlConnection_&)>::function(in_stack_ffffffffffffffa8);
  *(undefined8 *)(in_RDI + 2) = in_RSI;
  in_RDI[2].lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  TorControlReply::TorControlReply(in_RDI);
  std::
  deque<std::function<void_(TorControlConnection_&,_const_TorControlReply_&)>,_std::allocator<std::function<void_(TorControlConnection_&,_const_TorControlReply_&)>_>_>
  ::deque((deque<std::function<void_(TorControlConnection_&,_const_TorControlReply_&)>,_std::allocator<std::function<void_(TorControlConnection_&,_const_TorControlReply_&)>_>_>
           *)in_stack_ffffffffffffffa8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

TorControlConnection::TorControlConnection(struct event_base* _base)
    : base(_base)
{
}